

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ParenthesizedEventExpressionSyntax *pPVar1;
  Token TVar2;
  Token TVar3;
  BumpAllocator *in_stack_00000108;
  Token *in_stack_00000110;
  BumpAllocator *in_stack_ffffffffffffffb8;
  BumpAllocator *this;
  
  this = (BumpAllocator *)__child_stack;
  TVar2 = parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  not_null<slang::syntax::EventExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::EventExpressionSyntax_*> *)0x7a2e33);
  deepClone<slang::syntax::EventExpressionSyntax>
            ((EventExpressionSyntax *)__child_stack,in_stack_ffffffffffffffb8);
  TVar3 = parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  pPVar1 = BumpAllocator::
           emplace<slang::syntax::ParenthesizedEventExpressionSyntax,slang::parsing::Token,slang::syntax::EventExpressionSyntax&,slang::parsing::Token>
                     (this,(Token *)TVar2.info,TVar2._0_8_,(Token *)TVar3.info);
  return (int)pPVar1;
}

Assistant:

static SyntaxNode* clone(const ParenthesizedEventExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ParenthesizedEventExpressionSyntax>(
        node.openParen.deepClone(alloc),
        *deepClone<EventExpressionSyntax>(*node.expr, alloc),
        node.closeParen.deepClone(alloc)
    );
}